

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::AsyncIoStreamWithGuards::whenWriteDisconnected(AsyncIoStreamWithGuards *this)

{
  SourceLocation location;
  undefined8 node;
  long in_RSI;
  undefined1 local_40 [40];
  
  if (*(char *)(in_RSI + 0x49) == '\x01') {
    (**(code **)(*(long *)(*(long *)(in_RSI + 0x20) + 8) + 0x18))(this,*(long *)(in_RSI + 0x20) + 8)
    ;
  }
  else {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_40);
    local_40._8_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    local_40._16_8_ = "whenWriteDisconnected";
    local_40._24_8_ = (EventLoop *)0xe00001290;
    location.function = "whenWriteDisconnected";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location.lineNumber = 0x1290;
    location.columnNumber = 0xe;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::whenWriteDisconnected()::_lambda()_1_,kj::AsyncIoStreamWithGuards::whenWriteDisconnected()::_lambda(kj::Exception&&)_1_>
              ((Promise<void> *)this,(anon_class_8_1_8991fb9c_for_func *)local_40,
               (anon_class_1_0_00000001_for_errorHandler *)(local_40 + 0x20),location);
    node = local_40._0_8_;
    if ((PromiseArenaMember *)local_40._0_8_ != (PromiseArenaMember *)0x0) {
      local_40._0_8_ = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    if (writeGuardReleased) {
      return inner->whenWriteDisconnected();
    } else {
      return writeGuard.addBranch().then([this]() {
        return inner->whenWriteDisconnected();
      }, [](kj::Exception&& e) mutable -> kj::Promise<void> {
        if (e.getType() == kj::Exception::Type::DISCONNECTED) {
          return kj::READY_NOW;
        } else {
          return kj::mv(e);
        }
      });
    }
  }